

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (VkComputePipelineCreateInfo *pipe,
               MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc,Value *out_value)

{
  VkSpecializationInfo *pVVar1;
  VkSpecializationMapEntry *pVVar2;
  bool bVar3;
  DynamicStateInfo *dynamic_state_info;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *size;
  uint32_t i;
  ulong uVar4;
  SizeType SVar5;
  long lVar6;
  Value spec;
  Value stage;
  Data local_1a8;
  Value map_entries;
  Value map_entry;
  StringRefType local_160;
  StringRefType local_150;
  StringRefType local_140;
  StringRefType local_130;
  StringRefType local_120;
  StringRefType local_110;
  StringRefType local_100;
  StringRefType local_f0;
  GenericStringRef<char> local_e0;
  StringRefType local_d0;
  StringRefType local_c0;
  StringRefType local_b0;
  StringRefType local_a0;
  StringRefType local_90;
  StringRefType local_80;
  StringRefType local_70;
  StringRefType local_60;
  string local_50;
  
  local_1a8.n.i64 = (Number)0x0;
  local_1a8.s.str = (Ch *)0x3000000000000;
  local_60.s = "flags";
  SVar5 = 5;
  local_60.length = SVar5;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_1a8.s,&local_60,pipe->flags,alloc);
  local_70.s = "layout";
  local_70.length = 6;
  uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ((Fossilize *)&spec,(uint64_t)pipe->layout,alloc);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_1a8.s,&local_70,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&spec,alloc);
  local_80.s = "basePipelineHandle";
  local_80.length = 0x12;
  uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ((Fossilize *)&spec,(uint64_t)pipe->basePipelineHandle,alloc);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_1a8.s,&local_80,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&spec,alloc);
  local_90.s = "basePipelineIndex";
  local_90.length = 0x11;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<int>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&local_1a8.s,&local_90,pipe->basePipelineIndex,alloc);
  stage.data_.n = (Number)0x0;
  stage.data_.s.str = (Ch *)0x3000000000000;
  local_a0.s = "flags";
  local_a0.length = SVar5;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>(&stage,&local_a0,(pipe->stage).flags,alloc);
  local_b0.s = "stage";
  local_b0.length = SVar5;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<VkShaderStageFlagBits>(&stage,&local_b0,(pipe->stage).stage,alloc);
  local_c0.s = "module";
  local_c0.length = 6;
  uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ((Fossilize *)&spec,(uint64_t)(pipe->stage).module,alloc);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&stage,&local_c0,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&spec,alloc);
  local_d0.s = "name";
  local_d0.length = 4;
  rapidjson::GenericStringRef<char>::GenericStringRef(&local_e0,(pipe->stage).pName);
  dynamic_state_info = (DynamicStateInfo *)alloc;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&stage,&local_d0,&local_e0,alloc);
  pVVar1 = (pipe->stage).pSpecializationInfo;
  if (pVVar1 != (VkSpecializationInfo *)0x0) {
    spec.data_.n = (Number)0x0;
    spec.data_.s.str = (Ch *)0x3000000000000;
    local_f0.s = "dataSize";
    local_f0.length = 8;
    size = alloc;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_long>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&spec,&local_f0,pVVar1->dataSize,alloc);
    local_100.s = "data";
    local_100.length = 4;
    pVVar1 = (pipe->stage).pSpecializationInfo;
    encode_base64_abi_cxx11_
              (&local_50,(Fossilize *)pVVar1->pData,(void *)pVVar1->dataSize,(size_t)size);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
    AddMember<std::__cxx11::string>
              ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                *)&spec,&local_100,&local_50,alloc);
    std::__cxx11::string::_M_dispose();
    map_entries.data_.n = (Number)0x0;
    map_entries.data_.s.str = (Ch *)0x4000000000000;
    lVar6 = 8;
    for (uVar4 = 0; pVVar1 = (pipe->stage).pSpecializationInfo, uVar4 < pVVar1->mapEntryCount;
        uVar4 = uVar4 + 1) {
      pVVar2 = pVVar1->pMapEntries;
      map_entry.data_.n = (Number)0x0;
      map_entry.data_.s.str = (Ch *)0x3000000000000;
      local_140.s = "offset";
      local_140.length = 6;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>(&map_entry,&local_140,*(uint *)((long)pVVar2 + lVar6 + -4),alloc);
      local_150.s = "size";
      local_150.length = 4;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_long>
                (&map_entry,&local_150,*(unsigned_long *)((long)&pVVar2->constantID + lVar6),alloc);
      local_160.s = "constantID";
      local_160.length = 10;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>(&map_entry,&local_160,*(uint *)((long)pVVar2 + lVar6 + -8),alloc);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::PushBack(&map_entries,&map_entry,alloc);
      lVar6 = lVar6 + 0x10;
    }
    local_110.s = "mapEntries";
    local_110.length = 10;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(&spec,&local_110,&map_entries,alloc);
    local_120.s = "specializationInfo";
    local_120.length = 0x12;
    dynamic_state_info = (DynamicStateInfo *)alloc;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(&stage,&local_120,&spec,alloc);
  }
  bVar3 = pnext_chain_add_json_value<VkPipelineShaderStageCreateInfo,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    (&stage,&pipe->stage,alloc,dynamic_state_info);
  if (bVar3) {
    local_130.s = "stage";
    local_130.length = 5;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_1a8.s,&local_130,&stage,alloc);
    if (pipe->pNext != (void *)0x0) {
      spec.data_.n = (Number)0x0;
      spec.data_.s.str = (Ch *)0x0;
      bVar3 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        (pipe->pNext,alloc,&spec,(DynamicStateInfo *)0x0);
      if (!bVar3) goto LAB_0011ec6e;
      map_entries.data_.n = (Number)anon_var_dwarf_2996b;
      map_entries.data_._8_4_ = 5;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_1a8.s,(StringRefType *)&map_entries,&spec,alloc);
    }
    bVar3 = true;
    if (&local_1a8 != &out_value->data_) {
      (out_value->data_).n = local_1a8.n;
      (out_value->data_).s.str = local_1a8.s.str;
    }
  }
  else {
LAB_0011ec6e:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

static bool json_value(const VkComputePipelineCreateInfo& pipe, Allocator& alloc, Value *out_value)
{
	Value p(kObjectType);
	p.AddMember("flags", pipe.flags, alloc);
	p.AddMember("layout", uint64_string(api_object_cast<uint64_t>(pipe.layout), alloc), alloc);
	p.AddMember("basePipelineHandle", uint64_string(api_object_cast<uint64_t>(pipe.basePipelineHandle), alloc), alloc);
	p.AddMember("basePipelineIndex", pipe.basePipelineIndex, alloc);
	Value stage(kObjectType);
	stage.AddMember("flags", pipe.stage.flags, alloc);
	stage.AddMember("stage", pipe.stage.stage, alloc);
	stage.AddMember("module", uint64_string(api_object_cast<uint64_t>(pipe.stage.module), alloc), alloc);
	stage.AddMember("name", StringRef(pipe.stage.pName), alloc);
	if (pipe.stage.pSpecializationInfo)
	{
		Value spec(kObjectType);
		spec.AddMember("dataSize", uint64_t(pipe.stage.pSpecializationInfo->dataSize), alloc);
		spec.AddMember("data",
		               encode_base64(pipe.stage.pSpecializationInfo->pData,
		                             pipe.stage.pSpecializationInfo->dataSize), alloc);
		Value map_entries(kArrayType);
		for (uint32_t i = 0; i < pipe.stage.pSpecializationInfo->mapEntryCount; i++)
		{
			auto &e = pipe.stage.pSpecializationInfo->pMapEntries[i];
			Value map_entry(kObjectType);
			map_entry.AddMember("offset", e.offset, alloc);
			map_entry.AddMember("size", uint64_t(e.size), alloc);
			map_entry.AddMember("constantID", e.constantID, alloc);
			map_entries.PushBack(map_entry, alloc);
		}
		spec.AddMember("mapEntries", map_entries, alloc);
		stage.AddMember("specializationInfo", spec, alloc);
	}

	if (!pnext_chain_add_json_value(stage, pipe.stage, alloc, nullptr))
		return false;
	p.AddMember("stage", stage, alloc);

	if (!pnext_chain_add_json_value(p, pipe, alloc, nullptr))
		return false;

	*out_value = p;
	return true;
}